

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# automations.cpp
# Opt level: O0

void __thiscall rtosc::AutomationMgr::clearSlot(AutomationMgr *this,int slot_id)

{
  undefined1 *puVar1;
  long lVar2;
  int in_ESI;
  long *in_RDI;
  int i_1;
  int i;
  AutomationSlot *s;
  int local_20;
  int local_1c;
  undefined4 in_stack_fffffffffffffff0;
  
  if ((in_ESI < (int)in_RDI[1]) && (-1 < in_ESI)) {
    puVar1 = (undefined1 *)(*in_RDI + (long)in_ESI * 0xa0);
    *puVar1 = 0;
    puVar1[1] = 0;
    if (*(int *)(puVar1 + 4) != 0) {
      *(int *)((long)in_RDI + 0x14) = *(int *)((long)in_RDI + 0x14) + -1;
    }
    for (local_1c = 0; local_1c < (int)in_RDI[1]; local_1c = local_1c + 1) {
      if (*(int *)(puVar1 + 4) < *(int *)(*in_RDI + (long)local_1c * 0xa0 + 4)) {
        lVar2 = *in_RDI + (long)local_1c * 0xa0;
        *(int *)(lVar2 + 4) = *(int *)(lVar2 + 4) + -1;
      }
    }
    *(undefined4 *)(puVar1 + 4) = 0xffffffff;
    *(undefined4 *)(puVar1 + 8) = 0xffffffff;
    *(undefined4 *)(puVar1 + 0xc) = 0xffffffff;
    *(undefined4 *)(puVar1 + 0x10) = 0;
    memset(puVar1 + 0x14,0,0x80);
    snprintf(puVar1 + 0x14,0x80,"Slot %d",(ulong)(in_ESI + 1));
    for (local_20 = 0; local_20 < *(int *)((long)in_RDI + 0xc); local_20 = local_20 + 1) {
      clearSlotSub((AutomationMgr *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                   (int)((ulong)puVar1 >> 0x20),(int)puVar1);
    }
    *(undefined4 *)(in_RDI + 10) = 1;
  }
  return;
}

Assistant:

void AutomationMgr::clearSlot(int slot_id)
{
    if(slot_id >= nslots || slot_id < 0)
        return;
    auto &s = slots[slot_id];
    s.active = false;
    s.used   = false;
    if(s.learning)
        learn_queue_len--;
    for(int i=0; i<nslots; ++i)
        if(slots[i].learning > s.learning)
            slots[i].learning--;
    s.learning = -1;
    s.midi_cc  = -1;
    s.midi_nrpn  = -1;
    s.current_state = 0;
    memset(s.name, 0, sizeof(s.name));
    snprintf(s.name, sizeof(s.name), "Slot %d", slot_id + 1);
    for(int i=0; i<per_slot; ++i)
        clearSlotSub(slot_id, i);
    damaged = true;
}